

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O2

void __thiscall hypermind::CompileUnit::CompileUnit(CompileUnit *this,VM *mVm,Compiler *compiler)

{
  undefined8 *puVar1;
  long lVar2;
  
  this->mVM = mVm;
  this->mScopeDepth = -1;
  lVar2 = 0;
  do {
    (&this->mUpvalues[0].isDirectOuterLocalVar)[lVar2] = false;
    *(undefined4 *)((long)&this->mUpvalues[0].index + lVar2) = 0;
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x400);
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)&this->mLocalVariables[0].signature.name + lVar2 + 5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->mLocalVariables[0].signature.length + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0x1000);
  this->mOuter = (CompileUnit *)0x0;
  this->mLocalVarNumber = 0;
  this->mStackSlotNum = 0;
  this->mFn = (HMFunction *)0x0;
  this->mCurCompiler = compiler;
  this->mCurClassInfo = (ClassInfo *)0x0;
  this->mCurBlockInfo = (BlockInfo *)0x0;
  (this->mLables).data = (uint *)0x0;
  (this->mLables).count = 0;
  (this->mLables).capacity = 0;
  this->mLine = 0;
  this->mColumn = 0;
  return;
}

Assistant:

explicit CompileUnit(VM *mVm, Compiler *compiler) : mVM(mVm), mCurCompiler(compiler) {}